

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ay8910.c
# Opt level: O0

void ay8910_update_one(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  DEV_SMPL *pDVar1;
  DEV_SMPL *pDVar2;
  byte bVar3;
  uint uVar4;
  uint local_74;
  uint local_64;
  uint local_54;
  int local_44;
  DEV_SMPL chnout;
  DEV_SMPL *bufR;
  DEV_SMPL *bufL;
  UINT32 cur_smpl;
  int chan;
  ay8910_context *psg;
  DEV_SMPL **outputs_local;
  UINT32 samples_local;
  void *param_local;
  
  pDVar1 = *outputs;
  pDVar2 = outputs[1];
  memset(*outputs,0,(ulong)samples << 2);
  memset(outputs[1],0,(ulong)samples << 2);
  if (*(char *)((long)param + 0x2ce) == '\0') {
    for (bufL._0_4_ = 0; (uint)bufL < samples; bufL._0_4_ = (uint)bufL + 1) {
      for (bufL._4_4_ = 0; bufL._4_4_ < 3; bufL._4_4_ = bufL._4_4_ + 1) {
        *(int *)((long)param + (long)bufL._4_4_ * 4 + 0x24) =
             *(int *)((long)param + (long)bufL._4_4_ * 4 + 0x24) + 1;
        if ((int)((uint)*(byte *)((long)param + (long)(bufL._4_4_ << 1) + 0x10) |
                 (*(byte *)((long)param + (long)(int)(bufL._4_4_ << 1 | 1) + 0x10) & 0xf) << 8) <=
            *(int *)((long)param + (long)bufL._4_4_ * 4 + 0x24)) {
          *(byte *)((long)param + (long)bufL._4_4_ + 0x30) =
               *(byte *)((long)param + (long)bufL._4_4_ + 0x30) ^ 1;
          *(undefined4 *)((long)param + (long)bufL._4_4_ * 4 + 0x24) = 0;
        }
      }
      *(int *)((long)param + 0x34) = *(int *)((long)param + 0x34) + 1;
      if ((int)(*(byte *)((long)param + 0x16) & 0x1f) <= *(int *)((long)param + 0x34)) {
        *(undefined4 *)((long)param + 0x34) = 0;
        *(byte *)((long)param + 0x33) = *(byte *)((long)param + 0x33) ^ 1;
        if (*(char *)((long)param + 0x33) != '\0') {
          *(uint *)((long)param + 0x48) =
               (*(uint *)((long)param + 0x48) & 1 ^ *(int *)((long)param + 0x48) >> 3 & 1U) << 0x11
               ^ *(uint *)((long)param + 0x48);
          *(int *)((long)param + 0x48) = *(int *)((long)param + 0x48) >> 1;
        }
      }
      for (bufL._4_4_ = 0; bufL._4_4_ < 3; bufL._4_4_ = bufL._4_4_ + 1) {
        *(byte *)((long)param + (long)bufL._4_4_ + 0x55) =
             (*(byte *)((long)param + (long)bufL._4_4_ + 0x30) |
             (byte)((int)(uint)*(byte *)((long)param + 0x17) >> ((byte)bufL._4_4_ & 0x1f)) & 1) &
             ((byte)*(undefined4 *)((long)param + 0x48) & 1 |
             (byte)((int)(uint)*(byte *)((long)param + 0x17) >> ((byte)bufL._4_4_ + 3 & 0x1f)) & 1);
      }
      if ((*(char *)((long)param + 0x47) == '\0') &&
         (*(int *)((long)param + 0x38) = *(int *)((long)param + 0x38) + 1,
         (int)((uint)*(ushort *)((long)param + 0x1b) * *(int *)((long)param + 0x50)) <=
         *(int *)((long)param + 0x38))) {
        *(undefined4 *)((long)param + 0x38) = 0;
        *(char *)((long)param + 0x3c) = *(char *)((long)param + 0x3c) + -1;
        if (*(char *)((long)param + 0x3c) < '\0') {
          if (*(char *)((long)param + 0x44) == '\0') {
            if ((*(char *)((long)param + 0x45) != '\0') &&
               (((int)*(char *)((long)param + 0x3c) & *(byte *)((long)param + 0x4c) + 1) != 0)) {
              *(byte *)((long)param + 0x46) =
                   *(byte *)((long)param + 0x46) ^ *(byte *)((long)param + 0x4c);
            }
            *(byte *)((long)param + 0x3c) =
                 *(byte *)((long)param + 0x3c) & *(byte *)((long)param + 0x4c);
          }
          else {
            if (*(char *)((long)param + 0x45) != '\0') {
              *(byte *)((long)param + 0x46) =
                   *(byte *)((long)param + 0x46) ^ *(byte *)((long)param + 0x4c);
            }
            *(undefined1 *)((long)param + 0x47) = 1;
            *(undefined1 *)((long)param + 0x3c) = 0;
          }
        }
      }
      *(uint *)((long)param + 0x40) =
           (int)*(char *)((long)param + 0x3c) ^ (uint)*(byte *)((long)param + 0x46);
      for (bufL._4_4_ = 0; bufL._4_4_ < 3; bufL._4_4_ = bufL._4_4_ + 1) {
        if (*(int *)((long)param + (long)bufL._4_4_ * 4 + 700) != 0) {
          uVar4 = 1;
          if (*(char *)((long)param + 0x2cc) == '\x04') {
            uVar4 = 3;
          }
          if (((int)(uint)*(byte *)((long)param + (long)(bufL._4_4_ + 8) + 0x10) >> 4 & uVar4) == 0)
          {
            if (*(char *)((long)param + (long)bufL._4_4_ + 0x55) == '\0') {
              local_74 = 0;
            }
            else {
              local_74 = *(byte *)((long)param + (long)(bufL._4_4_ + 8) + 0x10) & 0xf;
            }
            local_44 = *(int *)((long)param +
                               (long)(int)local_74 * 4 + (long)bufL._4_4_ * 0x40 + 0x68);
          }
          else if (*(char *)((long)param + 0x2cc) == '\x04') {
            if (*(char *)((long)param + (long)bufL._4_4_ + 0x55) == '\0') {
              local_54 = 0;
            }
            else {
              bVar3 = 1;
              if (*(char *)((long)param + 0x2cc) == '\x04') {
                bVar3 = 3;
              }
              local_54 = *(uint *)((long)param + 0x40) >>
                         (3 - ((byte)((int)(uint)*(byte *)((long)param +
                                                          (long)(bufL._4_4_ + 8) + 0x10) >> 4) &
                              bVar3) & 0x1f);
            }
            local_44 = *(int *)((long)param + (ulong)local_54 * 4 + (long)bufL._4_4_ * 0x80 + 0x128)
            ;
          }
          else {
            if (*(char *)((long)param + (long)bufL._4_4_ + 0x55) == '\0') {
              local_64 = 0;
            }
            else {
              local_64 = *(uint *)((long)param + 0x40);
            }
            local_44 = *(int *)((long)param + (ulong)local_64 * 4 + (long)bufL._4_4_ * 0x80 + 0x128)
            ;
          }
          if ((*(byte *)((long)param + (long)bufL._4_4_ + 0x2b8) & 1) != 0) {
            pDVar1[(uint)bufL] = local_44 + pDVar1[(uint)bufL];
          }
          if ((*(byte *)((long)param + (long)bufL._4_4_ + 0x2b8) & 2) != 0) {
            pDVar2[(uint)bufL] = local_44 + pDVar2[(uint)bufL];
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ay8910_update_one(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	ay8910_context *psg = (ay8910_context *)param;
	int chan;
	UINT32 cur_smpl;
	DEV_SMPL *bufL = outputs[0];
	DEV_SMPL *bufR = outputs[1];
	DEV_SMPL chnout;
	
	memset(outputs[0], 0x00, samples * sizeof(DEV_SMPL));
	memset(outputs[1], 0x00, samples * sizeof(DEV_SMPL));
	
	// Speed hack for OPN chips (YM2203, YM26xx), that have an often unused AY8910
	if (psg->IsDisabled)
		return;
	
	/* The 8910 has three outputs, each output is the mix of one of the three */
	/* tone generators and of the (single) noise generator. The two are mixed */
	/* BEFORE going into the DAC. The formula to mix each channel is: */
	/* (ToneOn | ToneDisable) & (NoiseOn | NoiseDisable). */
	/* Note that this means that if both tone and noise are disabled, the output */
	/* is 1, not 0, and can be modulated changing the volume. */

	/* buffering loop */
	for (cur_smpl = 0; cur_smpl < samples; cur_smpl++)
	{
		for (chan = 0; chan < NUM_CHANNELS; chan++)
		{
			psg->count[chan]++;
			if (psg->count[chan] >= TONE_PERIOD(psg, chan))
			{
				psg->output[chan] ^= 1;
				psg->count[chan] = 0;
			}
		}

		psg->count_noise++;
		if (psg->count_noise >= NOISE_PERIOD(psg))
		{
			/* toggle the prescaler output. Noise is no different to
			 * channels.
			 */
			psg->count_noise = 0;
			psg->prescale_noise ^= 1;

			if ( psg->prescale_noise)
			{
				/* The Random Number Generator of the 8910 is a 17-bit shift */
				/* register. The input to the shift register is bit0 XOR bit3 */
				/* (bit0 is the output). This was verified on AY-3-8910 and YM2149 chips. */

				psg->rng ^= (((psg->rng & 1) ^ ((psg->rng >> 3) & 1)) << 17);
				psg->rng >>= 1;
			}
		}

		for (chan = 0; chan < NUM_CHANNELS; chan++)
		{
			psg->vol_enabled[chan] = (psg->output[chan] | TONE_ENABLEQ(psg, chan)) & (NOISE_OUTPUT(psg) | NOISE_ENABLEQ(psg, chan));
		}

		/* update envelope */
		if (psg->holding == 0)
		{
			psg->count_env++;
			if (psg->count_env >= ENVELOPE_PERIOD(psg) * psg->step )
			{
				psg->count_env = 0;
				psg->env_step--;

				/* check envelope current position */
				if (psg->env_step < 0)
				{
					if (psg->hold)
					{
						if (psg->alternate)
							psg->attack ^= psg->env_step_mask;
						psg->holding = 1;
						psg->env_step = 0;
					}
					else
					{
						/* if CountEnv has looped an odd number of times (usually 1), */
						/* invert the output. */
						if (psg->alternate && (psg->env_step & (psg->env_step_mask + 1)))
 							psg->attack ^= psg->env_step_mask;

						psg->env_step &= psg->env_step_mask;
					}
				}

			}
		}
		psg->env_volume = (psg->env_step ^ psg->attack);

#if ENABLE_CUSTOM_OUTPUTS
		if (psg->streams == 3)
#endif
		{
			for (chan = 0; chan < NUM_CHANNELS; chan++)
			{
				if (! psg->MuteMsk[chan])
					continue;
				if (TONE_ENVELOPE(psg, chan) != 0)
				{
					if (psg->chip_type == AYTYPE_AY8914) // AY8914 Has a two bit tone_envelope field
					{
						chnout = psg->env_table[chan][psg->vol_enabled[chan] ? psg->env_volume >> (3-TONE_ENVELOPE(psg,chan)) : 0];
					}
					else
					{
						chnout = psg->env_table[chan][psg->vol_enabled[chan] ? psg->env_volume : 0];
					}
				}
				else
				{
					chnout = psg->vol_table[chan][psg->vol_enabled[chan] ? TONE_VOLUME(psg, chan) : 0];
				}
				if (psg->StereoMask[chan] & 0x01)
					bufL[cur_smpl] += chnout;
				if (psg->StereoMask[chan] & 0x02)
					bufR[cur_smpl] += chnout;
			}
		}
#if ENABLE_CUSTOM_OUTPUTS
		else
		{
			chnout = mix_3D(psg);
			bufL[cur_smpl] += chnout;
			bufR[cur_smpl] += chnout;
		}
#endif
	}
}